

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O1

void __thiscall Snake::UpdateHead(Snake *this)

{
  float fVar1;
  double dVar2;
  
  switch(this->direction) {
  case kUp:
    fVar1 = this->head_y - this->speed;
    break;
  case kDown:
    fVar1 = this->speed + this->head_y;
    break;
  case kLeft:
    fVar1 = this->head_x - this->speed;
    goto LAB_00103d3a;
  case kRight:
    fVar1 = this->speed + this->head_x;
LAB_00103d3a:
    this->head_x = fVar1;
  default:
    goto switchD_00103d16_default;
  }
  this->head_y = fVar1;
switchD_00103d16_default:
  dVar2 = fmod((double)((float)this->grid_width + this->head_x),(double)this->grid_width);
  this->head_x = (float)dVar2;
  dVar2 = fmod((double)((float)this->grid_height + this->head_y),(double)this->grid_height);
  this->head_y = (float)dVar2;
  return;
}

Assistant:

void Snake::UpdateHead() {
  switch (direction) {
    case Direction::kUp:
      head_y -= speed;
      break;

    case Direction::kDown:
      head_y += speed;
      break;

    case Direction::kLeft:
      head_x -= speed;
      break;

    case Direction::kRight:
      head_x += speed;
      break;
  }

  // Wrap the Snake around to the beginning if going off of the screen.
  head_x = fmod(head_x + grid_width, grid_width);
  head_y = fmod(head_y + grid_height, grid_height);
}